

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ManMuxesDeref(Aig_Man_t *pAig,Vec_Ptr_t *vMuxes)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  int local_3c;
  int i;
  Aig_Obj_t *pNodeC;
  Aig_Obj_t *pNodeE;
  Aig_Obj_t *pNodeT;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMuxes_local;
  Aig_Man_t *pAig_local;
  
  pObj = (Aig_Obj_t *)vMuxes;
  vMuxes_local = (Vec_Ptr_t *)pAig;
  for (local_3c = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pObj), local_3c < iVar1;
      local_3c = local_3c + 1) {
    pNodeT = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pObj,local_3c);
    iVar1 = Aig_ObjRecognizeExor(pNodeT,&pNodeE,&pNodeC);
    if (iVar1 == 0) {
      pAVar2 = Aig_ObjRecognizeMux(pNodeT,&pNodeE,&pNodeC);
      *(ulong *)&pAVar2->field_0x18 =
           *(ulong *)&pAVar2->field_0x18 & 0xffffffff0000003f |
           ((ulong)(((uint)(*(ulong *)&pAVar2->field_0x18 >> 6) & 0x3ffffff) - 1) & 0x3ffffff) << 6;
    }
    else {
      *(ulong *)&pNodeE->field_0x18 =
           *(ulong *)&pNodeE->field_0x18 & 0xffffffff0000003f |
           ((ulong)(((uint)(*(ulong *)&pNodeE->field_0x18 >> 6) & 0x3ffffff) - 1) & 0x3ffffff) << 6;
      *(ulong *)&pNodeC->field_0x18 =
           *(ulong *)&pNodeC->field_0x18 & 0xffffffff0000003f |
           ((ulong)(((uint)(*(ulong *)&pNodeC->field_0x18 >> 6) & 0x3ffffff) - 1) & 0x3ffffff) << 6;
    }
  }
  return;
}

Assistant:

void Aig_ManMuxesDeref( Aig_Man_t * pAig, Vec_Ptr_t * vMuxes )
{
    Aig_Obj_t * pObj, * pNodeT, * pNodeE, * pNodeC;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMuxes, pObj, i )
    {
        if ( Aig_ObjRecognizeExor( pObj, &pNodeT, &pNodeE ) )
        {
            pNodeT->nRefs--;
            pNodeE->nRefs--;
        }
        else
        {
            pNodeC = Aig_ObjRecognizeMux( pObj, &pNodeT, &pNodeE );
            pNodeC->nRefs--;
        }
    }
}